

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseMedia(Parser *this,MediaRule *mediaRule)

{
  TokenType TVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  Symbol *pSVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->symbols).d.size;
  uVar6 = (ulong)(uint)this->index;
  do {
    lVar9 = (long)(int)uVar6;
    if (lVar9 < lVar4) {
      pSVar7 = (this->symbols).d.ptr;
      if (pSVar7[lVar9].token == S) {
        pSVar7 = pSVar7 + lVar9;
        lVar2 = -1;
        do {
          lVar10 = lVar2;
          pSVar7 = pSVar7 + 1;
          if (lVar9 - lVar4 == lVar10) break;
          lVar2 = lVar10 + -1;
        } while (pSVar7->token == S);
        uVar5 = (int)uVar6 - (int)lVar10;
        uVar6 = (ulong)uVar5;
        this->index = uVar5;
      }
      lVar9 = (long)(int)uVar6;
    }
    if ((lVar4 <= lVar9) || ((this->symbols).d.ptr[lVar9].token != IDENT)) goto LAB_005e2342;
    this->index = (int)uVar6 + 1;
    parseMedium(this,&mediaRule->media);
    uVar5 = this->index;
    lVar9 = (long)(int)uVar5;
    lVar4 = (this->symbols).d.size;
    if (lVar4 <= lVar9) {
      uVar6 = (ulong)uVar5;
      goto LAB_005e2342;
    }
    uVar6 = lVar9 + 1;
    TVar1 = (this->symbols).d.ptr[lVar9].token;
    this->index = (int)uVar6;
  } while (TVar1 == COMMA);
  pSVar7 = (this->symbols).d.ptr;
  if (pSVar7[lVar9].token == LBRACE) {
    lVar9 = lVar4 - uVar6;
    if (lVar9 != 0 && (long)uVar6 <= lVar4) {
      iVar8 = uVar5 + 2;
      pSVar7 = pSVar7 + uVar6;
      do {
        if (pSVar7->token != S) break;
        this->index = iVar8;
        iVar8 = iVar8 + 1;
        pSVar7 = pSVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    bVar3 = testSimpleSelector(this);
    if (bVar3) {
      do {
        local_78.selectors.d.d = (Data *)0x0;
        local_78.selectors.d.ptr = (Selector *)0x0;
        local_78.selectors.d.size = 0;
        local_78.declarations.d.d = (Data *)0x0;
        local_78.declarations.d.ptr = (Declaration *)0x0;
        local_78.declarations.d.size = 0;
        local_78.order = 0;
        local_78._52_4_ = 0xaaaaaaaa;
        bVar3 = parseRuleset(this,&local_78);
        if (!bVar3) {
          QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
          QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                    ((QArrayDataPointer<QCss::Selector> *)&local_78);
          goto LAB_005e2345;
        }
        QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                  ((QMovableArrayOps<QCss::StyleRule> *)&mediaRule->styleRules,
                   (mediaRule->styleRules).d.size,&local_78);
        QList<QCss::StyleRule>::end(&mediaRule->styleRules);
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
        QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Selector> *)&local_78);
        bVar3 = testSimpleSelector(this);
      } while (bVar3);
    }
    uVar5 = this->index;
    lVar9 = (long)(int)uVar5;
    lVar4 = (this->symbols).d.size;
    if (lVar9 < lVar4) {
      uVar6 = lVar9 + 1;
      this->index = (int)uVar6;
      pSVar7 = (this->symbols).d.ptr;
      if (pSVar7[lVar9].token == RBRACE) {
        bVar3 = true;
        lVar9 = lVar4 - uVar6;
        if (lVar9 != 0 && (long)uVar6 <= lVar4) {
          iVar8 = uVar5 + 2;
          pSVar7 = pSVar7 + uVar6;
          do {
            if (pSVar7->token != S) break;
            this->index = iVar8;
            iVar8 = iVar8 + 1;
            pSVar7 = pSVar7 + 1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        goto LAB_005e2347;
      }
    }
    else {
      uVar6 = (ulong)uVar5;
    }
    this->errorIndex = (int)uVar6;
  }
  else {
LAB_005e2342:
    this->errorIndex = (int)uVar6;
  }
LAB_005e2345:
  bVar3 = false;
LAB_005e2347:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Parser::parseMedia(MediaRule *mediaRule)
{
    do {
        skipSpace();
        if (!parseNextMedium(&mediaRule->media)) return false;
    } while (test(COMMA));

    if (!next(LBRACE)) return false;
    skipSpace();

    while (testRuleset()) {
        StyleRule rule;
        if (!parseRuleset(&rule)) return false;
        mediaRule->styleRules.append(rule);
    }

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}